

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flip.c
# Opt level: O3

rt_function_error_t free_flip_local_context(rt_function_t *f)

{
  void *pvVar1;
  rt_list_t s;
  rt_list_t s_00;
  
  pvVar1 = *f->local_context;
  s._4_4_ = 0;
  s.size = *(uint *)((long)pvVar1 + 0x20);
  s.data = *(int **)((long)pvVar1 + 0x28);
  free_list(s);
  s_00._4_4_ = 0;
  s_00.size = *(uint *)((long)pvVar1 + 0x30);
  s_00.data = *(int **)((long)pvVar1 + 0x38);
  free_list(s_00);
  (*rt_free_func)(*(void **)((long)pvVar1 + 0x40));
  (*rt_free_func)(pvVar1);
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t free_flip_local_context(rt_function_t *f) {
  flip_private_t *p =
      (flip_private_t *)(((flip_local_context_t *)(f->local_context))->data);
  free_list(p->in_position);
  free_list(p->out_position);
  rt_free_func(p->flip);
  rt_free_func(p);
  return RT_FUNCTION_ERROR_NOERROR;
}